

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O0

UBool __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::populatePreceding(BreakCache *this,UErrorCode *status)

{
  int32_t firstRuleStatus;
  int32_t startPos;
  UBool UVar1;
  bool bVar2;
  int64_t iVar3;
  bool bVar4;
  UBool success;
  int32_t dictSegEndPosition;
  int32_t iStack_34;
  UBool segmentHandledByDictionary;
  int32_t prevStatusIdx;
  int32_t prevPosition;
  int32_t backupPosition;
  int32_t positionStatusIdx;
  int32_t position;
  int32_t fromPosition;
  UErrorCode *status_local;
  BreakCache *this_local;
  
  _position = status;
  status_local = (UErrorCode *)this;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    positionStatusIdx = this->fBoundaries[this->fStartBufIdx];
    if (positionStatusIdx == 0) {
      this_local._7_1_ = false;
    }
    else {
      backupPosition = 0;
      prevPosition = 0;
      UVar1 = DictionaryCache::preceding
                        (this->fBI->fDictionaryCache,positionStatusIdx,&backupPosition,&prevPosition
                        );
      if (UVar1 == '\0') {
        prevStatusIdx = positionStatusIdx;
        do {
          if (prevStatusIdx + -0x1e < 1) {
            prevStatusIdx = 0;
          }
          else {
            prevStatusIdx = handleSafePrevious(this->fBI,prevStatusIdx + -0x1e);
          }
          if ((prevStatusIdx == -1) || (prevStatusIdx == 0)) {
            backupPosition = 0;
            prevPosition = 0;
          }
          else {
            this->fBI->fPosition = prevStatusIdx;
            backupPosition = handleNext(this->fBI);
            if (backupPosition <= prevStatusIdx + 4) {
              utext_setNativeIndex_63(&this->fBI->fText,(long)backupPosition);
              iVar3 = utext_getPreviousNativeIndex_63(&this->fBI->fText);
              if (prevStatusIdx == iVar3) {
                backupPosition = handleNext(this->fBI);
              }
            }
            prevPosition = this->fBI->fRuleStatusIndex;
          }
        } while (positionStatusIdx <= backupPosition);
        UVector32::removeAllElements(&this->fSideBuffer);
        UVector32::addElement(&this->fSideBuffer,backupPosition,_position);
        UVector32::addElement(&this->fSideBuffer,prevPosition,_position);
        do {
          startPos = backupPosition;
          firstRuleStatus = prevPosition;
          this->fBI->fPosition = backupPosition;
          iStack_34 = backupPosition;
          backupPosition = handleNext(this->fBI);
          prevPosition = this->fBI->fRuleStatusIndex;
          if (backupPosition == -1) break;
          bVar4 = false;
          if (this->fBI->fDictionaryCharCount != 0) {
            DictionaryCache::populateDictionary
                      (this->fBI->fDictionaryCache,startPos,backupPosition,firstRuleStatus,
                       prevPosition);
            while ((UVar1 = DictionaryCache::following
                                      (this->fBI->fDictionaryCache,iStack_34,&backupPosition,
                                       &prevPosition), UVar1 != '\0' &&
                   (bVar4 = true, backupPosition < positionStatusIdx))) {
              UVector32::addElement(&this->fSideBuffer,backupPosition,_position);
              UVector32::addElement(&this->fSideBuffer,prevPosition,_position);
              iStack_34 = backupPosition;
            }
          }
          if ((!bVar4) && (backupPosition < positionStatusIdx)) {
            UVector32::addElement(&this->fSideBuffer,backupPosition,_position);
            UVector32::addElement(&this->fSideBuffer,prevPosition,_position);
          }
        } while (backupPosition < positionStatusIdx);
        UVar1 = UVector32::isEmpty(&this->fSideBuffer);
        bVar4 = UVar1 == '\0';
        if (bVar4) {
          prevPosition = UVector32::popi(&this->fSideBuffer);
          backupPosition = UVector32::popi(&this->fSideBuffer);
          addPreceding(this,backupPosition,prevPosition,UpdateCachePosition);
        }
        do {
          UVar1 = UVector32::isEmpty(&this->fSideBuffer);
          if (UVar1 != '\0') {
            return bVar4;
          }
          prevPosition = UVector32::popi(&this->fSideBuffer);
          backupPosition = UVector32::popi(&this->fSideBuffer);
          bVar2 = addPreceding(this,backupPosition,prevPosition,RetainCachePosition);
          this_local._7_1_ = bVar4;
        } while (bVar2);
      }
      else {
        addPreceding(this,backupPosition,prevPosition,UpdateCachePosition);
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

UBool RuleBasedBreakIterator::BreakCache::populatePreceding(UErrorCode &status) {
    if (U_FAILURE(status)) {
        return FALSE;
    }

    int32_t fromPosition = fBoundaries[fStartBufIdx];
    if (fromPosition == 0) {
        return FALSE;
    }

    int32_t position = 0;
    int32_t positionStatusIdx = 0;

    if (fBI->fDictionaryCache->preceding(fromPosition, &position, &positionStatusIdx)) {
        addPreceding(position, positionStatusIdx, UpdateCachePosition);
        return TRUE;
    }

    int32_t backupPosition = fromPosition;

    // Find a boundary somewhere preceding the first already-cached boundary
    do {
        backupPosition = backupPosition - 30;
        if (backupPosition <= 0) {
            backupPosition = 0;
        } else {
            backupPosition = fBI->handleSafePrevious(backupPosition);
        }
        if (backupPosition == UBRK_DONE || backupPosition == 0) {
            position = 0;
            positionStatusIdx = 0;
        } else {
            // Advance to the boundary following the backup position.
            // There is a complication: the safe reverse rules identify pairs of code points
            // that are safe. If advancing from the safe point moves forwards by less than
            // two code points, we need to advance one more time to ensure that the boundary
            // is good, including a correct rules status value.
            //
            fBI->fPosition = backupPosition;
            position = fBI->handleNext();
            if (position <= backupPosition + 4) {
                // +4 is a quick test for possibly having advanced only one codepoint.
                // Four being the length of the longest potential code point, a supplementary in UTF-8
                utext_setNativeIndex(&fBI->fText, position);
                if (backupPosition == utext_getPreviousNativeIndex(&fBI->fText)) {
                    // The initial handleNext() only advanced by a single code point. Go again.
                    position = fBI->handleNext();   // Safe rules identify safe pairs.
                }
            };
            positionStatusIdx = fBI->fRuleStatusIndex;
        }
    } while (position >= fromPosition);

    // Find boundaries between the one we just located and the first already-cached boundary
    // Put them in a side buffer, because we don't yet know where they will fall in the circular cache buffer..

    fSideBuffer.removeAllElements();
    fSideBuffer.addElement(position, status);
    fSideBuffer.addElement(positionStatusIdx, status);

    do {
        int32_t prevPosition = fBI->fPosition = position;
        int32_t prevStatusIdx = positionStatusIdx;
        position = fBI->handleNext();
        positionStatusIdx = fBI->fRuleStatusIndex;
        if (position == UBRK_DONE) {
            break;
        }

        UBool segmentHandledByDictionary = FALSE;
        if (fBI->fDictionaryCharCount != 0) {
            // Segment from the rules includes dictionary characters.
            // Subdivide it, with subdivided results going into the dictionary cache.
            int32_t dictSegEndPosition = position;
            fBI->fDictionaryCache->populateDictionary(prevPosition, dictSegEndPosition, prevStatusIdx, positionStatusIdx);
            while (fBI->fDictionaryCache->following(prevPosition, &position, &positionStatusIdx)) {
                segmentHandledByDictionary = true;
                U_ASSERT(position > prevPosition);
                if (position >= fromPosition) {
                    break;
                }
                U_ASSERT(position <= dictSegEndPosition);
                fSideBuffer.addElement(position, status);
                fSideBuffer.addElement(positionStatusIdx, status);
                prevPosition = position;
            }
            U_ASSERT(position==dictSegEndPosition || position>=fromPosition);
        }

        if (!segmentHandledByDictionary && position < fromPosition) {
            fSideBuffer.addElement(position, status);
            fSideBuffer.addElement(positionStatusIdx, status);
        }
    } while (position < fromPosition);

    // Move boundaries from the side buffer to the main circular buffer.
    UBool success = FALSE;
    if (!fSideBuffer.isEmpty()) {
        positionStatusIdx = fSideBuffer.popi();
        position = fSideBuffer.popi();
        addPreceding(position, positionStatusIdx, UpdateCachePosition);
        success = TRUE;
    }

    while (!fSideBuffer.isEmpty()) {
        positionStatusIdx = fSideBuffer.popi();
        position = fSideBuffer.popi();
        if (!addPreceding(position, positionStatusIdx, RetainCachePosition)) {
            // No space in circular buffer to hold a new preceding result while
            // also retaining the current cache (iteration) position.
            // Bailing out is safe; the cache will refill again if needed.
            break;
        }
    }

    return success;
}